

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

ExprPtr __thiscall pegmatite::regex(pegmatite *this,wchar_t *s)

{
  Expr *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  
  __p = (Expr *)operator_new(0x28);
  __p->_vptr_Expr = (_func_int **)&PTR__RegexExpr_00158360;
  std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::basic_regex
            ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)(__p + 1),s,4);
  *(Expr **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<pegmatite::Expr*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr regex(const wchar_t *s)
{
	return ExprPtr(new RegexExpr<wchar_t>(s));
}